

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

char absl::lts_20250127::str_format_internal::anon_unknown_0::MultiplyBy10WithCarry<unsigned_long>
               (unsigned_long *v,char carry)

{
  ulong uVar1;
  undefined7 in_register_00000031;
  uint128 uVar2;
  
  uVar2.hi_ = 0;
  uVar2.lo_ = *v;
  uVar2 = lts_20250127::operator*((uint128)ZEXT816(10),uVar2);
  uVar1 = (ulong)(int)CONCAT71(in_register_00000031,carry);
  *v = uVar1 + uVar2.lo_;
  return (carry >> 7) + (char)uVar2.hi_ + CARRY8(uVar1,uVar2.lo_);
}

Assistant:

inline char MultiplyBy10WithCarry(Int* v, char carry) {
  using BiggerInt = absl::conditional_t<sizeof(Int) == 4, uint64_t, uint128>;
  BiggerInt tmp =
      10 * static_cast<BiggerInt>(*v) + static_cast<BiggerInt>(carry);
  *v = static_cast<Int>(tmp);
  return static_cast<char>(tmp >> (sizeof(Int) * 8));
}